

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::MultiPartInputFile::initialize(MultiPartInputFile *this)

{
  _Base_ptr p_Var1;
  uint uVar2;
  bool bVar3;
  Data *pDVar4;
  string *psVar5;
  iterator iVar6;
  InputPartData *this_00;
  ArgExc *this_01;
  InputExc *pIVar7;
  long *plVar8;
  size_type *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  code *pcVar11;
  long lVar12;
  Header *src;
  char *pcVar13;
  undefined *puVar14;
  pointer pHVar15;
  ulong uVar16;
  undefined1 *type;
  long lVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  attrs;
  Header header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [40];
  IStream *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined8 local_68;
  IStream *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  GenericInputFile::readMagicNumberAndVersionField
            (&this->super_GenericInputFile,(this->_data->super_InputStreamMutex).is,
             &this->_data->version);
  uVar2 = this->_data->version;
  if ((~uVar2 & 0x1200) == 0) {
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc((InputExc *)this_01,"Multipart files cannot have the tiled bit set")
    ;
    puVar14 = &Iex_2_5::InputExc::typeinfo;
    pcVar11 = Iex_2_5::InputExc::~InputExc;
LAB_001598c8:
    __cxa_throw(this_01,puVar14,pcVar11);
  }
  do {
    local_e8._M_dataplus._M_p = (pointer)0x0;
    Header::Header((Header *)local_88,0x40,0x40,1.0,(V2f *)&local_e8,1.0,INCREASING_Y,
                   ZIP_COMPRESSION);
    Header::readFrom((Header *)local_88,(this->_data->super_InputStreamMutex).is,
                     &this->_data->version);
    bVar3 = Header::readsNothing((Header *)local_88);
    if (bVar3) {
      Header::~Header((Header *)local_88);
      break;
    }
    std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
              (&this->_data->_headers,(Header *)local_88);
    Header::~Header((Header *)local_88);
  } while ((uVar2 >> 0xc & 1) != 0);
  pHVar15 = (this->_data->_headers).
            super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_data->_headers).super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
      _M_impl.super__Vector_impl_data._M_finish != pHVar15) {
    type = TILEDIMAGE_abi_cxx11_;
    if ((uVar2 >> 9 & 1) == 0) {
      type = SCANLINEIMAGE_abi_cxx11_;
    }
    lVar17 = 0;
    uVar16 = 0;
    do {
      bVar3 = Header::hasType((Header *)(&(pHVar15->_map)._M_t._M_impl.field_0x0 + lVar17));
      if (!bVar3) {
        if ((uVar2 >> 0xc & 1) == 0) {
          pDVar4 = this->_data;
          goto LAB_001595df;
        }
        this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
        pcVar13 = "Every header in a multipart file should have a type";
LAB_001598b2:
        Iex_2_5::ArgExc::ArgExc(this_01,pcVar13);
        puVar14 = &Iex_2_5::ArgExc::typeinfo;
        pcVar11 = Iex_2_5::ArgExc::~ArgExc;
        goto LAB_001598c8;
      }
      if (((uVar2 >> 0xc & 1) == 0) && (pDVar4 = this->_data, (pDVar4->version & 0x800) == 0)) {
LAB_001595df:
        Header::setType((Header *)
                        ((long)&(((pDVar4->_headers).
                                  super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl +
                        lVar17),(string *)type);
      }
      bVar3 = Header::hasName((Header *)
                              ((long)&(((this->_data->_headers).
                                        super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t.
                                      _M_impl + lVar17));
      if (!bVar3 && (uVar2 >> 0xc & 1) != 0) {
        this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
        pcVar13 = "Every header in a multipart file should have a name";
        goto LAB_001598b2;
      }
      psVar5 = Header::type_abi_cxx11_
                         ((Header *)
                          ((long)&(((this->_data->_headers).
                                    super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl +
                          lVar17));
      bVar3 = isTiled(psVar5);
      Header::sanityCheck((Header *)
                          ((long)&(((this->_data->_headers).
                                    super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl +
                          lVar17),bVar3,(bool)((byte)(uVar2 >> 0xc) & 1));
      uVar16 = uVar16 + 1;
      pHVar15 = (this->_data->_headers).
                super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar17 = lVar17 + 0x38;
    } while (uVar16 < (ulong)(((long)(this->_data->_headers).
                                     super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar15 >> 3
                              ) * 0x6db6db6db6db6db7));
  }
  if ((uVar2 >> 0xc & 1) != 0) {
    p_Var1 = (_Base_ptr)(local_88 + 8);
    local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
    local_78._M_allocated_capacity = 0;
    local_60 = (IStream *)0x0;
    pHVar15 = (this->_data->_headers).
              super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_78._8_8_ = p_Var1;
    local_68 = p_Var1;
    if ((this->_data->_headers).
        super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
        super__Vector_impl_data._M_finish != pHVar15) {
      lVar17 = 0;
      uVar16 = 0;
      do {
        psVar5 = Header::name_abi_cxx11_
                           ((Header *)(&(pHVar15->_map)._M_t._M_impl.field_0x0 + lVar17));
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_88,psVar5);
        if (iVar6._M_node != p_Var1) {
          pIVar7 = (InputExc *)__cxa_allocate_exception(0x48);
          psVar5 = Header::name_abi_cxx11_
                             ((Header *)
                              ((long)&(((this->_data->_headers).
                                        super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t.
                                      _M_impl + lVar17));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_c8 + 0x20),"Header name ",psVar5);
          plVar8 = (long *)std::__cxx11::string::append(local_c8 + 0x20);
          local_e8._M_dataplus._M_p = (pointer)*plVar8;
          psVar9 = (size_type *)(plVar8 + 2);
          if ((size_type *)local_e8._M_dataplus._M_p == psVar9) {
            local_e8.field_2._M_allocated_capacity = *psVar9;
            local_e8.field_2._8_8_ = plVar8[3];
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar9;
          }
          local_e8._M_string_length = plVar8[1];
          *plVar8 = (long)psVar9;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          Iex_2_5::InputExc::InputExc(pIVar7,(string *)&local_e8);
          __cxa_throw(pIVar7,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
        }
        psVar5 = Header::name_abi_cxx11_
                           ((Header *)
                            ((long)&(((this->_data->_headers).
                                      super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl
                            + lVar17));
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_88,psVar5);
        uVar16 = uVar16 + 1;
        pHVar15 = (this->_data->_headers).
                  super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar17 = lVar17 + 0x38;
      } while (uVar16 < (ulong)(((long)(this->_data->_headers).
                                       super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar15 >>
                                3) * 0x6db6db6db6db6db7));
    }
    pDVar4 = (Data *)local_88;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)pDVar4);
    src = (this->_data->_headers).
          super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
          super__Vector_impl_data._M_start;
    if (1 < (ulong)(((long)(this->_data->_headers).
                           super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)src >> 3) *
                   0x6db6db6db6db6db7)) {
      uVar16 = 1;
      lVar17 = 0x38;
      do {
        local_c8._0_8_ = 0;
        local_c8._8_8_ = 0;
        local_c8._16_8_ = 0;
        bVar3 = Data::checkSharedAttributesValues
                          (pDVar4,src,(Header *)(&(src->_map)._M_t._M_impl.field_0x0 + lVar17),
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_c8);
        if (bVar3) {
          local_88._0_8_ = &local_78;
          local_88._8_8_ = 0;
          local_78._M_allocated_capacity = local_78._M_allocated_capacity & 0xffffffffffffff00;
          if (local_c8._8_8_ != local_c8._0_8_) {
            lVar12 = 0;
            uVar16 = 0;
            do {
              std::operator+(&local_e8," ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_c8._0_8_ + lVar12));
              std::__cxx11::string::_M_append(local_88,(ulong)local_e8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              uVar16 = uVar16 + 1;
              lVar12 = lVar12 + 0x20;
            } while (uVar16 < (ulong)((long)(local_c8._8_8_ - local_c8._0_8_) >> 5));
          }
          pIVar7 = (InputExc *)__cxa_allocate_exception(0x48);
          psVar5 = Header::name_abi_cxx11_
                             ((Header *)
                              ((long)&(((this->_data->_headers).
                                        super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t.
                                      _M_impl + lVar17));
          std::operator+(&local_50,"Header name ",psVar5);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_c8._32_8_ = *plVar8;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._32_8_ == paVar10) {
            local_98._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_98._8_8_ = plVar8[3];
            local_c8._32_8_ = &local_98;
          }
          else {
            local_98._M_allocated_capacity = paVar10->_M_allocated_capacity;
          }
          local_a0 = (IStream *)plVar8[1];
          *plVar8 = (long)paVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::operator+(&local_e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_c8 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88);
          Iex_2_5::InputExc::InputExc(pIVar7,(string *)&local_e8);
          __cxa_throw(pIVar7,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
        }
        pDVar4 = (Data *)local_c8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c8);
        uVar16 = uVar16 + 1;
        src = (this->_data->_headers).
              super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
              super__Vector_impl_data._M_start;
        lVar17 = lVar17 + 0x38;
      } while (uVar16 < (ulong)(((long)(this->_data->_headers).
                                       super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)src >> 3)
                               * 0x6db6db6db6db6db7));
    }
  }
  pDVar4 = this->_data;
  if ((pDVar4->_headers).super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pDVar4->_headers).super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar17 = 0;
    uVar16 = 0;
    do {
      this_00 = (InputPartData *)operator_new(0x70);
      InputPartData::InputPartData
                (this_00,&pDVar4->super_InputStreamMutex,
                 (Header *)
                 ((long)&(((pDVar4->_headers).
                           super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
                           _M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl + lVar17),
                 (int)uVar16,pDVar4->numThreads,pDVar4->version);
      local_88._0_8_ = this_00;
      std::vector<Imf_2_5::InputPartData*,std::allocator<Imf_2_5::InputPartData*>>::
      emplace_back<Imf_2_5::InputPartData*>
                ((vector<Imf_2_5::InputPartData*,std::allocator<Imf_2_5::InputPartData*>> *)
                 &pDVar4->parts,(InputPartData **)local_88);
      uVar16 = uVar16 + 1;
      pDVar4 = this->_data;
      lVar17 = lVar17 + 0x38;
    } while (uVar16 < (ulong)(((long)(pDVar4->_headers).
                                     super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pDVar4->_headers).
                                     super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7));
  }
  Data::readChunkOffsetTables(pDVar4,pDVar4->reconstructChunkOffsetTable);
  return;
}

Assistant:

void
MultiPartInputFile::initialize()
{
    readMagicNumberAndVersionField(*_data->is, _data->version);
    
    bool multipart = isMultiPart(_data->version);
    bool tiled = isTiled(_data->version);

    //
    // Multipart files don't have and shouldn't have the tiled bit set.
    //

    if (tiled && multipart)
        throw IEX_NAMESPACE::InputExc ("Multipart files cannot have the tiled bit set");

    
    int pos = 0;
    while (true)
    {
        Header header;
        header.readFrom(*_data->is, _data->version);

        //
        // If we read nothing then we stop reading.
        //

        if (header.readsNothing())
        {
            pos++;
            break;
        }

        _data->_headers.push_back(header);
        
        if(multipart == false)
          break;
    }

    //
    // Perform usual check on headers.
    //

    for (size_t i = 0; i < _data->_headers.size(); i++)
    {
        //
        // Silently invent a type if the file is a single part regular image.
        //

        if( _data->_headers[i].hasType() == false )
        {
            if(multipart)

                throw IEX_NAMESPACE::ArgExc ("Every header in a multipart file should have a type");
          
            _data->_headers[i].setType(tiled ? TILEDIMAGE : SCANLINEIMAGE);
        }
        else
        {
            
            //
            // Silently fix the header type if it's wrong
            // (happens when a regular Image file written by EXR_2.0 is rewritten by an older library,
            //  so doesn't effect deep image types)
            //

            if(!multipart && !isNonImage(_data->version))
            {
                _data->_headers[i].setType(tiled ? TILEDIMAGE : SCANLINEIMAGE);
            }
        }
         

        
        if( _data->_headers[i].hasName() == false )
        {
            if(multipart)
                throw IEX_NAMESPACE::ArgExc ("Every header in a multipart file should have a name");
        }
        
        if (isTiled(_data->_headers[i].type()))
            _data->_headers[i].sanityCheck(true, multipart);
        else
            _data->_headers[i].sanityCheck(false, multipart);
    }

    //
    // Check name uniqueness.
    //

    if (multipart)
    {
        set<string> names;
        for (size_t i = 0; i < _data->_headers.size(); i++)
        {
        
            if (names.find(_data->_headers[i].name()) != names.end())
            {
                throw IEX_NAMESPACE::InputExc ("Header name " + _data->_headers[i].name() +
                                   " is not a unique name.");
            }
            names.insert(_data->_headers[i].name());
        }
    }
    
    //
    // Check shared attributes compliance.
    //

    if (multipart && strictSharedAttribute)
    {
        for (size_t i = 1; i < _data->_headers.size(); i++)
        {
            vector <string> attrs;
            if (_data->checkSharedAttributesValues (_data->_headers[0], _data->_headers[i], attrs))
            {
                string attrNames;
                for (size_t j=0; j<attrs.size(); j++)
                    attrNames += " " + attrs[j];
                throw IEX_NAMESPACE::InputExc ("Header name " + _data->_headers[i].name() +
                                     " has non-conforming shared attributes: "+
                                     attrNames);
            }
        }
    }

    //
    // Create InputParts and read chunk offset tables.
    //
        
    for (size_t i = 0; i < _data->_headers.size(); i++)
        _data->parts.push_back(
                new InputPartData(_data, _data->_headers[i], i, _data->numThreads, _data->version));

    _data->readChunkOffsetTables(_data->reconstructChunkOffsetTable);
}